

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O1

void __thiscall udpdiscovery::impl::PeerEnv::deleteIdle(PeerEnv *this,long cur_time_ms)

{
  list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_> *this_00;
  ulong uVar1;
  vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  to_delete;
  value_type local_50;
  vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  local_48;
  
  pthread_mutex_lock((pthread_mutex_t *)&this->lock_);
  local_48.
  super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (_List_iterator<udpdiscovery::DiscoveredPeer> *)0x0;
  local_48.
  super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (_List_iterator<udpdiscovery::DiscoveredPeer> *)0x0;
  local_48.
  super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (_List_iterator<udpdiscovery::DiscoveredPeer> *)0x0;
  this_00 = &this->discovered_peers_;
  local_50._M_node =
       (this->discovered_peers_).
       super__List_base<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>
       ._M_impl._M_node.super__List_node_base._M_next;
  if (local_50._M_node != (_List_node_base *)this_00) {
    do {
      if ((this->parameters_).discovered_peer_ttl_ms_ <
          cur_time_ms - (long)local_50._M_node[4]._M_next) {
        if (local_48.
            super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            local_48.
            super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
          ::_M_realloc_insert(&local_48,
                              (iterator)
                              local_48.
                              super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,&local_50);
        }
        else {
          (local_48.
           super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)->_M_node = local_50._M_node;
          local_48.
          super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_48.
               super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
        }
      }
      local_50._M_node = (local_50._M_node)->_M_next;
    } while (local_50._M_node != (_List_node_base *)this_00);
  }
  if (local_48.
      super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_48.
      super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar1 = 0;
    do {
      std::__cxx11::
      list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::_M_erase
                (this_00,local_48.
                         super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_node);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)local_48.
                                   super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_48.
                                   super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
  if (local_48.
      super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (_List_iterator<udpdiscovery::DiscoveredPeer> *)0x0) {
    operator_delete(local_48.
                    super__Vector_base<std::_List_iterator<udpdiscovery::DiscoveredPeer>,_std::allocator<std::_List_iterator<udpdiscovery::DiscoveredPeer>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void deleteIdle(long cur_time_ms) {
    lock_.Lock();

    std::vector<std::list<DiscoveredPeer>::iterator> to_delete;
    for (std::list<DiscoveredPeer>::iterator it = discovered_peers_.begin();
         it != discovered_peers_.end(); ++it) {
      if (cur_time_ms - (*it).last_updated() >
          parameters_.discovered_peer_ttl_ms())
        to_delete.push_back(it);
    }

    for (size_t i = 0; i < to_delete.size(); ++i)
      discovered_peers_.erase(to_delete[i]);

    lock_.Unlock();
  }